

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void print_ilu_options(superlu_options_t *options)

{
  superlu_options_t *options_local;
  
  printf(".. ILU options:\n");
  printf("\tDiagPivotThresh\t%6.2e\n",options->DiagPivotThresh);
  printf("\ttau\t%6.2e\n",options->ILU_DropTol);
  printf("\tgamma\t%6.2f\n",options->ILU_FillFactor);
  printf("\tDropRule\t%0x\n",(ulong)(uint)options->ILU_DropRule);
  printf("\tMILU\t%d\n",(ulong)options->ILU_MILU);
  printf("\tMILU_ALPHA\t%6.2e\n",0x3f847ae147ae147b);
  printf("\tDiagFillTol\t%6.2e\n",options->ILU_FillTol);
  printf("..\n");
  return;
}

Assistant:

void print_ilu_options(const superlu_options_t *options)
{
    printf(".. ILU options:\n");
    printf("\tDiagPivotThresh\t%6.2e\n", options->DiagPivotThresh);
    printf("\ttau\t%6.2e\n", options->ILU_DropTol);
    printf("\tgamma\t%6.2f\n", options->ILU_FillFactor);
    printf("\tDropRule\t%0x\n", options->ILU_DropRule);
    printf("\tMILU\t%d\n", options->ILU_MILU);
    printf("\tMILU_ALPHA\t%6.2e\n", MILU_ALPHA);
    printf("\tDiagFillTol\t%6.2e\n", options->ILU_FillTol);
    printf("..\n");
}